

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::writeUint32High8(deUint8 *dst,deUint8 val)

{
  deUint32 uint32ByteOffsetBits24To32;
  deUint8 val_local;
  deUint8 *dst_local;
  
  dst[3] = val;
  return;
}

Assistant:

inline void writeUint32High8 (deUint8* dst, deUint8 val)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffsetBits24To32	= 3;
#else
	const deUint32 uint32ByteOffsetBits24To32	= 0;
#endif

	dst[uint32ByteOffsetBits24To32] = val;
}